

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  size_type sVar1;
  float *pfVar2;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar3;
  __type _Var4;
  double dVar5;
  int k_5;
  float sum_6;
  float *kptr_4;
  float *ptr_4;
  int j_8;
  float *outptr_5;
  int i_6;
  int k_4;
  float sum_5;
  float *vptr;
  float *qkptr;
  int j_7;
  float *outptr_4;
  int i_5;
  Mat xvm;
  Mat xqkm;
  int j_6;
  int j_5;
  float sum_4;
  int j_4;
  float max;
  float *ptr_3;
  int i_4;
  Mat outm_4;
  int k_3;
  float sum_3;
  float *kptr_3;
  float *qptr;
  int j_3;
  float *outptr_3;
  int i_3;
  Mat outm_3;
  Mat xkm;
  Mat xqm;
  float *outptr_2;
  int k_2;
  float sum_2;
  float *kptr_2;
  float *ptr_2;
  int j_2;
  int i_2;
  Mat outm_2;
  int k_1;
  float sum_1;
  float *kptr_1;
  float *ptr_1;
  int j_1;
  float *outptr_1;
  int i_1;
  Mat outm_1;
  int k;
  float sum;
  float *kptr;
  float *ptr;
  int j;
  float *outptr;
  int i;
  Mat outm;
  int q;
  float inv_sqrt_embed_dim_per_head;
  Mat xqkv;
  Mat xqk;
  Mat xv;
  Mat xk;
  Mat xq;
  Mat *top_blob;
  int embed_dim_per_head;
  int seqlen;
  Mat *v_blob;
  Mat *k_blob;
  Mat *q_blob;
  Mat *m_10;
  Mat *m_9;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_ffffffffffffeb68;
  Allocator *in_stack_ffffffffffffeb70;
  int in_stack_ffffffffffffeb78;
  int in_stack_ffffffffffffeb7c;
  undefined4 in_stack_ffffffffffffeb80;
  int in_stack_ffffffffffffeb84;
  undefined8 in_stack_ffffffffffffeb88;
  void **ppvVar6;
  Mat *in_stack_ffffffffffffeb90;
  const_reference local_11e0;
  const_reference local_11d8;
  int local_11c8;
  float local_11c4;
  float *local_11c0;
  undefined8 local_11b8;
  undefined8 local_11b0;
  undefined8 local_11a8;
  undefined4 local_11a0;
  long *local_1198;
  undefined4 local_1190;
  undefined4 local_118c;
  undefined4 local_1188;
  undefined4 local_1184;
  undefined4 local_1180;
  undefined8 local_1178;
  float *local_1170;
  int local_1164;
  void *local_1160;
  int local_1154;
  int local_1150;
  float local_114c;
  float *local_1148;
  float *local_1140;
  int local_1134;
  undefined8 local_1130;
  undefined8 local_1128;
  undefined8 local_1120;
  undefined4 local_1118;
  long *local_1110;
  undefined4 local_1108;
  undefined4 local_1104;
  undefined4 local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined8 local_10f0;
  void *local_10e8;
  int local_10dc;
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined4 local_10c0;
  long *local_10b8;
  undefined4 local_10b0;
  undefined4 local_10ac;
  undefined4 local_10a8;
  undefined4 local_10a4;
  undefined4 local_10a0;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined8 local_1088;
  undefined8 local_1080;
  undefined4 local_1078;
  long *local_1070;
  undefined4 local_1068;
  undefined4 local_1064;
  undefined4 local_1060;
  undefined4 local_105c;
  undefined4 local_1058;
  undefined8 local_1050;
  int local_1044;
  int local_1040;
  float local_103c;
  int local_1038;
  float local_1034;
  void *local_1030;
  int local_1024;
  void *local_1020;
  int *local_1018;
  ulong local_1010;
  undefined4 local_1008;
  long *local_1000;
  int local_ff8;
  int local_ff4;
  int local_ff0;
  undefined4 local_fec;
  undefined4 local_fe8;
  ulong local_fe0;
  int local_fd8;
  float local_fd4;
  float *local_fd0;
  float *local_fc8;
  int local_fbc;
  void *local_fb8;
  int local_fac;
  undefined8 local_fa8;
  undefined8 local_fa0;
  undefined8 local_f98;
  undefined4 local_f90;
  long *local_f88;
  undefined4 local_f80;
  undefined4 local_f7c;
  undefined4 local_f78;
  undefined4 local_f74;
  undefined4 local_f70;
  undefined8 local_f68;
  undefined8 local_f60;
  undefined8 local_f58;
  undefined8 local_f50;
  undefined4 local_f48;
  long *local_f40;
  undefined4 local_f38;
  undefined4 local_f34;
  undefined4 local_f30;
  undefined4 local_f2c;
  undefined4 local_f28;
  undefined8 local_f20;
  undefined8 local_f18;
  undefined8 local_f10;
  undefined8 local_f08;
  undefined4 local_f00;
  long *local_ef8;
  undefined4 local_ef0;
  undefined4 local_eec;
  undefined4 local_ee8;
  undefined4 local_ee4;
  undefined4 local_ee0;
  undefined8 local_ed8;
  void *local_ed0;
  int local_ec8;
  float local_ec4;
  float *local_ec0;
  float *local_eb8;
  int local_eb0;
  int local_eac;
  undefined8 local_ea8;
  undefined8 local_ea0;
  undefined8 local_e98;
  undefined4 local_e90;
  long *local_e88;
  undefined4 local_e80;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined4 local_e70;
  undefined8 local_e68;
  int local_e60;
  float local_e5c;
  float *local_e58;
  float *local_e50;
  int local_e44;
  void *local_e40;
  int local_e34;
  undefined8 local_e30;
  undefined8 local_e28;
  undefined8 local_e20;
  undefined4 local_e18;
  long *local_e10;
  undefined4 local_e08;
  undefined4 local_e04;
  undefined4 local_e00;
  undefined4 local_dfc;
  undefined4 local_df8;
  undefined8 local_df0;
  int local_de8;
  float local_de4;
  float *local_de0;
  float *local_dd8;
  int local_dcc;
  void *local_dc8;
  int local_dbc;
  undefined8 local_db8;
  undefined8 local_db0;
  undefined8 local_da8;
  undefined4 local_da0;
  long *local_d98;
  undefined4 local_d90;
  undefined4 local_d8c;
  undefined4 local_d88;
  undefined4 local_d84;
  undefined4 local_d80;
  undefined8 local_d78;
  int local_d70;
  float local_d6c;
  void *local_d68;
  int *local_d60;
  long local_d58;
  undefined4 local_d50;
  long *local_d48;
  undefined4 local_d40;
  int local_d3c;
  int local_d38;
  undefined4 local_d34;
  undefined4 local_d30;
  long local_d28;
  void *local_d20;
  int *local_d18;
  ulong local_d10;
  undefined4 local_d08;
  long *local_d00;
  int local_cf8;
  int local_cf4;
  int local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  long local_ce0;
  void *local_cd8;
  int *local_cd0;
  long local_cc8;
  undefined4 local_cc0;
  long *local_cb8;
  undefined4 local_cb0;
  int local_cac;
  int local_ca8;
  undefined4 local_ca4;
  undefined4 local_ca0;
  long local_c98;
  void *local_c80;
  int *local_c78;
  long local_c70;
  undefined4 local_c68;
  long *local_c60;
  undefined4 local_c58;
  int local_c54;
  int local_c50;
  undefined4 local_c4c;
  undefined4 local_c48;
  long local_c40;
  void *local_c38;
  int *local_c30;
  long local_c28;
  undefined4 local_c20;
  long *local_c18;
  undefined4 local_c10;
  int local_c0c;
  int local_c08;
  undefined4 local_c04;
  undefined4 local_c00;
  long local_bf8;
  reference local_bf0;
  int local_be8;
  int local_be4;
  const_reference local_be0;
  const_reference local_bd8;
  const_reference local_bd0;
  long local_bc8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_bc0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_bb8;
  int local_ba4;
  undefined8 *local_ba0;
  undefined8 *local_b90;
  undefined8 *local_b80;
  undefined8 *local_b70;
  undefined8 *local_b60;
  undefined8 *local_b50;
  void **local_b40;
  undefined8 *local_b30;
  undefined8 *local_b20;
  undefined8 *local_b10;
  undefined8 *local_b00;
  void **local_af0;
  void **local_ae0;
  void **local_ad0;
  void **local_ac0;
  void **local_ab0;
  reference local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined4 local_a84;
  int local_a80;
  int local_a7c;
  void **local_a78;
  undefined8 local_a70;
  undefined8 local_a68;
  undefined4 local_a5c;
  int local_a58;
  int local_a54;
  void **local_a50;
  undefined8 local_a48;
  undefined8 local_a40;
  undefined4 local_a34;
  int local_a30;
  int local_a2c;
  void **local_a28;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined4 local_a0c;
  int local_a08;
  int local_a04;
  void **local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  int local_9e4;
  undefined4 local_9e0;
  int local_9dc;
  void **local_9d8;
  undefined1 local_9cd;
  int local_9cc;
  void **local_9c8;
  undefined8 *local_9c0;
  undefined1 local_9ad;
  int local_9ac;
  void **local_9a8;
  undefined8 *local_9a0;
  undefined1 local_98d;
  int local_98c;
  void **local_988;
  undefined8 *local_980;
  undefined1 local_96d;
  int local_96c;
  void **local_968;
  undefined8 *local_960;
  undefined1 local_94d;
  int local_94c;
  void **local_948;
  void **local_940;
  undefined1 local_92d;
  int local_92c;
  void **local_928;
  undefined8 *local_920;
  undefined1 local_90d;
  int local_90c;
  void **local_908;
  undefined8 *local_900;
  undefined1 local_8ed;
  int local_8ec;
  void **local_8e8;
  undefined8 *local_8e0;
  undefined1 local_8cd;
  int local_8cc;
  void **local_8c8;
  undefined8 *local_8c0;
  undefined1 local_8ad;
  int local_8ac;
  void **local_8a8;
  undefined8 *local_8a0;
  undefined1 local_88d;
  int local_88c;
  void **local_888;
  undefined8 *local_880;
  int local_86c;
  reference local_868;
  int local_85c;
  undefined8 *local_858;
  int local_84c;
  void **local_848;
  int local_83c;
  undefined8 *local_838;
  int local_82c;
  undefined8 *local_828;
  int local_81c;
  undefined8 *local_818;
  int local_80c;
  undefined8 *local_808;
  int local_7fc;
  undefined8 *local_7f8;
  int local_7ec;
  undefined8 *local_7e8;
  int local_7dc;
  undefined8 *local_7d8;
  int local_7cc;
  undefined8 *local_7c8;
  int local_7bc;
  const_reference local_7b8;
  int local_7ac;
  const_reference local_7a8;
  int local_79c;
  const_reference local_798;
  long *local_790;
  long *local_788;
  long *local_780;
  long *local_778;
  long local_770;
  long *local_768;
  long local_760;
  long *local_758;
  long local_750;
  long *local_748;
  long local_740;
  long *local_738;
  undefined8 *local_730;
  int local_668;
  undefined4 local_664;
  void **local_660;
  int local_648;
  undefined4 local_644;
  void **local_640;
  int local_628;
  undefined4 local_624;
  void **local_620;
  int local_608;
  undefined4 local_604;
  void **local_600;
  int local_5e8;
  undefined4 local_5e4;
  void **local_5e0;
  undefined8 *local_5c0;
  undefined8 *local_5a0;
  undefined8 *local_580;
  undefined8 *local_560;
  int local_548;
  undefined4 local_544;
  void **local_540;
  undefined8 *local_520;
  undefined8 *local_500;
  undefined8 *local_4e0;
  undefined8 *local_4c0;
  undefined8 *local_4a0;
  undefined8 *local_480;
  void *local_418;
  void *local_3c8;
  void *local_3b8;
  void *local_3a8;
  void *local_398;
  void *local_388;
  reference local_320;
  long *local_318;
  undefined4 local_30c;
  long local_308;
  void *local_300;
  undefined4 local_2f4;
  int local_2f0;
  int local_2ec;
  undefined8 *local_2e8;
  long *local_2e0;
  undefined4 local_2d4;
  long local_2d0;
  void *local_2c8;
  undefined4 local_2bc;
  int local_2b8;
  int local_2b4;
  undefined8 *local_2b0;
  long *local_2a8;
  undefined4 local_29c;
  long local_298;
  void *local_290;
  undefined4 local_284;
  int local_280;
  int local_27c;
  undefined8 *local_278;
  long *local_270;
  undefined4 local_264;
  long local_260;
  void *local_258;
  undefined4 local_24c;
  int local_248;
  int local_244;
  undefined8 *local_240;
  long *local_238;
  undefined4 local_22c;
  long local_228;
  void *local_220;
  undefined4 local_214;
  int local_210;
  int local_20c;
  undefined8 *local_208;
  long *local_200;
  undefined4 local_1f4;
  ulong local_1f0;
  void *local_1e8;
  undefined4 local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  long *local_1c8;
  undefined4 local_1bc;
  ulong local_1b8;
  void *local_1b0;
  undefined4 local_1a4;
  int local_1a0;
  int local_19c;
  void **local_198;
  long *local_190;
  undefined4 local_184;
  ulong local_180;
  void *local_178;
  undefined4 local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  long *local_158;
  undefined4 local_14c;
  long local_148;
  void *local_140;
  undefined4 local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  long *local_120;
  undefined4 local_114;
  long local_110;
  void *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long *local_e8;
  undefined4 local_dc;
  long local_d8;
  float *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_bc8 = in_RCX;
  local_bc0 = in_RDX;
  local_bb8 = in_RSI;
  local_bd0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_bb8);
  if (sVar1 == 1) {
    local_11d8 = local_bd0;
  }
  else {
    local_11d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_bb8,1);
  }
  local_bd8 = local_11d8;
  sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_bb8);
  if (sVar1 == 1) {
    local_11e0 = local_bd0;
  }
  else {
    local_11e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_bb8,2);
  }
  local_be0 = local_11e0;
  local_be4 = local_bd0->h;
  local_be8 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0xd4);
  local_bf0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_bc0,0);
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffeb84,in_stack_ffffffffffffeb80),
              in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78,(size_t)in_stack_ffffffffffffeb70,
              in_stack_ffffffffffffeb68);
  local_aa0 = local_bf0;
  bVar3 = true;
  if (local_bf0->data != (void *)0x0) {
    local_320 = local_bf0;
    bVar3 = local_bf0->cstep * (long)local_bf0->c == 0;
  }
  if (bVar3) {
    local_ba4 = -1;
  }
  else {
    local_a84 = *(undefined4 *)(in_RDI + 0xd4);
    local_a98 = *(undefined8 *)(local_bc8 + 0x10);
    local_a78 = &local_c38;
    local_a7c = local_be8;
    local_a80 = local_be4;
    local_a90 = 4;
    local_c38 = (void *)0x0;
    local_c30 = (int *)0x0;
    local_c28 = 0;
    local_c20 = 0;
    local_c18 = (long *)0x0;
    local_c10 = 0;
    local_c0c = 0;
    local_c08 = 0;
    local_c04 = 0;
    local_c00 = 0;
    local_bf8 = 0;
    Mat::create(in_stack_ffffffffffffeb90,(int)((ulong)in_stack_ffffffffffffeb88 >> 0x20),
                (int)in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb84,
                CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78),
                in_stack_ffffffffffffeb70);
    local_a5c = *(undefined4 *)(in_RDI + 0xd4);
    local_a70 = *(undefined8 *)(local_bc8 + 0x10);
    local_a50 = &local_c80;
    local_a54 = local_be8;
    local_a58 = local_be4;
    local_a68 = 4;
    local_c80 = (void *)0x0;
    local_c78 = (int *)0x0;
    local_c70 = 0;
    local_c68 = 0;
    local_c60 = (long *)0x0;
    local_c58 = 0;
    local_c54 = 0;
    local_c50 = 0;
    local_c4c = 0;
    local_c48 = 0;
    local_c40 = 0;
    Mat::create(in_stack_ffffffffffffeb90,(int)((ulong)in_stack_ffffffffffffeb88 >> 0x20),
                (int)in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb84,
                CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78),
                in_stack_ffffffffffffeb70);
    local_a34 = *(undefined4 *)(in_RDI + 0xd4);
    local_a48 = *(undefined8 *)(local_bc8 + 0x10);
    local_a28 = &local_cd8;
    local_a2c = local_be4;
    local_a30 = local_be8;
    local_a40 = 4;
    local_cd8 = (void *)0x0;
    local_cd0 = (int *)0x0;
    local_cc8 = 0;
    local_cc0 = 0;
    local_cb8 = (long *)0x0;
    local_cb0 = 0;
    local_cac = 0;
    local_ca8 = 0;
    local_ca4 = 0;
    local_ca0 = 0;
    local_c98 = 0;
    Mat::create(in_stack_ffffffffffffeb90,(int)((ulong)in_stack_ffffffffffffeb88 >> 0x20),
                (int)in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb84,
                CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78),
                in_stack_ffffffffffffeb70);
    local_a0c = *(undefined4 *)(in_RDI + 0xd4);
    local_a20 = *(undefined8 *)(local_bc8 + 0x10);
    local_a00 = &local_d20;
    local_a04 = local_be4;
    local_a08 = local_be4;
    local_a18 = 4;
    local_d20 = (void *)0x0;
    local_d18 = (int *)0x0;
    local_d10 = 0;
    local_d08 = 0;
    local_d00 = (long *)0x0;
    local_cf8 = 0;
    local_cf4 = 0;
    local_cf0 = 0;
    local_cec = 0;
    local_ce8 = 0;
    local_ce0 = 0;
    Mat::create(in_stack_ffffffffffffeb90,(int)((ulong)in_stack_ffffffffffffeb88 >> 0x20),
                (int)in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb84,
                CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78),
                in_stack_ffffffffffffeb70);
    local_9e0 = *(undefined4 *)(in_RDI + 0xd4);
    local_9f8 = *(undefined8 *)(local_bc8 + 0x10);
    local_9d8 = &local_d68;
    local_9dc = local_be8;
    local_9e4 = local_be4;
    local_9f0 = 4;
    local_d68 = (void *)0x0;
    local_d60 = (int *)0x0;
    local_d58 = 0;
    local_d50 = 0;
    local_d48 = (long *)0x0;
    local_d40 = 0;
    local_d3c = 0;
    local_d38 = 0;
    local_d34 = 0;
    local_d30 = 0;
    local_d28 = 0;
    Mat::create(in_stack_ffffffffffffeb90,(int)((ulong)in_stack_ffffffffffffeb88 >> 0x20),
                (int)in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb84,
                CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78),
                in_stack_ffffffffffffeb70);
    _Var4 = std::sqrt<int>(local_be8);
    local_d6c = (float)(1.0 / _Var4);
    for (local_d70 = 0; local_d70 < *(int *)(in_RDI + 0xd4); local_d70 = local_d70 + 1) {
      local_880 = &local_db8;
      local_888 = &local_c38;
      local_300 = (void *)((long)local_c38 + local_bf8 * local_d70 * local_c28);
      local_2e8 = &local_db8;
      local_8 = (long)local_c0c * (long)local_c08 * local_c28;
      for (local_dbc = 0; local_dbc < local_be4; local_dbc = local_dbc + 1) {
        local_80c = local_dbc;
        local_808 = &local_db8;
        local_dc8 = (void *)((long)local_300 + (long)local_c0c * (long)local_dbc * local_c28);
        for (local_dcc = 0; local_dcc < local_be8; local_dcc = local_dcc + 1) {
          local_798 = local_bd0;
          local_79c = local_dbc;
          local_778 = (long *)(in_RDI + 0xe0);
          local_738 = (long *)(in_RDI + 0x128);
          local_740 = (long)(local_d70 * local_be8 + local_dcc);
          local_de4 = *(float *)(*local_738 + local_740 * 4);
          local_de0 = (float *)(*local_778 +
                               (long)(*(int *)(in_RDI + 0xd0) * (local_d70 * local_be8 + local_dcc))
                               * 4);
          local_dd8 = (float *)((long)local_bd0->data +
                               (long)local_bd0->w * (long)local_dbc * local_bd0->elemsize);
          for (local_de8 = 0; local_de8 < *(int *)(in_RDI + 0xd0); local_de8 = local_de8 + 1) {
            local_de4 = *local_dd8 * *local_de0 + local_de4;
            local_de0 = local_de0 + 1;
            local_dd8 = local_dd8 + 1;
          }
          *(float *)((long)local_dc8 + (long)local_dcc * 4) = local_de4 * local_d6c;
        }
      }
      local_ba0 = &local_db8;
      local_8a0 = &local_e30;
      local_8a8 = &local_c80;
      local_2c8 = (void *)((long)local_c80 + local_c40 * local_d70 * local_c70);
      local_2b0 = &local_e30;
      local_18 = (long)local_c54 * (long)local_c50 * local_c70;
      for (local_e34 = 0; local_e34 < local_be4; local_e34 = local_e34 + 1) {
        local_81c = local_e34;
        local_818 = &local_e30;
        local_e40 = (void *)((long)local_2c8 + (long)local_c54 * (long)local_e34 * local_c70);
        for (local_e44 = 0; local_e44 < local_be8; local_e44 = local_e44 + 1) {
          local_7a8 = local_bd8;
          local_7ac = local_e34;
          local_780 = (long *)(in_RDI + 0x170);
          local_748 = (long *)(in_RDI + 0x1b8);
          local_750 = (long)(local_d70 * local_be8 + local_e44);
          local_e5c = *(float *)(*local_748 + local_750 * 4);
          local_e58 = (float *)(*local_780 +
                               (long)(*(int *)(in_RDI + 0xd0) * (local_d70 * local_be8 + local_e44))
                               * 4);
          local_e50 = (float *)((long)local_bd8->data +
                               (long)local_bd8->w * (long)local_e34 * local_bd8->elemsize);
          for (local_e60 = 0; local_e60 < *(int *)(in_RDI + 0xd0); local_e60 = local_e60 + 1) {
            local_e5c = *local_e50 * *local_e58 + local_e5c;
            local_e58 = local_e58 + 1;
            local_e50 = local_e50 + 1;
          }
          *(float *)((long)local_e40 + (long)local_e44 * 4) = local_e5c;
        }
      }
      local_b90 = &local_e30;
      local_8c0 = &local_ea8;
      local_8c8 = &local_cd8;
      local_290 = (void *)((long)local_cd8 + local_c98 * local_d70 * local_cc8);
      local_278 = &local_ea8;
      local_28 = (long)local_cac * (long)local_ca8 * local_cc8;
      for (local_eac = 0; local_eac < local_be8; local_eac = local_eac + 1) {
        for (local_eb0 = 0; local_eb0 < local_be4; local_eb0 = local_eb0 + 1) {
          local_7b8 = local_be0;
          local_7bc = local_eb0;
          local_788 = (long *)(in_RDI + 0x200);
          local_758 = (long *)(in_RDI + 0x248);
          local_760 = (long)(local_d70 * local_be8 + local_eac);
          local_ec4 = *(float *)(*local_758 + local_760 * 4);
          local_ec0 = (float *)(*local_788 +
                               (long)(*(int *)(in_RDI + 0xd0) * (local_d70 * local_be8 + local_eac))
                               * 4);
          local_eb8 = (float *)((long)local_be0->data +
                               (long)local_be0->w * (long)local_eb0 * local_be0->elemsize);
          for (local_ec8 = 0; local_ec8 < *(int *)(in_RDI + 0xd0); local_ec8 = local_ec8 + 1) {
            local_ec4 = *local_eb8 * *local_ec0 + local_ec4;
            local_ec0 = local_ec0 + 1;
            local_eb8 = local_eb8 + 1;
          }
          local_82c = local_eac;
          local_828 = &local_ea8;
          local_ed0 = (void *)((long)local_290 + (long)local_cac * (long)local_eac * local_cc8);
          *(float *)((long)local_ed0 + (long)local_eb0 * 4) = local_ec4;
        }
      }
      local_b80 = &local_ea8;
      local_8e0 = &local_f18;
      local_8e8 = &local_c38;
      local_258 = (void *)((long)local_c38 + local_bf8 * local_d70 * local_c28);
      local_240 = &local_f18;
      local_38 = (long)local_c0c * (long)local_c08 * local_c28;
      local_900 = &local_f60;
      local_908 = &local_c80;
      local_220 = (void *)((long)local_c80 + local_c40 * local_d70 * local_c70);
      local_208 = &local_f60;
      local_48 = (long)local_c54 * (long)local_c50 * local_c70;
      local_920 = &local_fa8;
      local_928 = &local_d20;
      local_1e8 = (void *)((long)local_d20 + local_ce0 * local_d70 * local_d10);
      local_1d0 = &local_fa8;
      local_58 = (long)local_cf4 * (long)local_cf0 * local_d10;
      for (local_fac = 0; local_fac < local_be4; local_fac = local_fac + 1) {
        local_83c = local_fac;
        local_838 = &local_fa8;
        local_fb8 = (void *)((long)local_1e8 + (long)local_cf4 * (long)local_fac * local_d10);
        for (local_fbc = 0; local_fbc < local_be4; local_fbc = local_fbc + 1) {
          local_7cc = local_fac;
          local_7c8 = &local_f18;
          local_7dc = local_fbc;
          local_7d8 = &local_f60;
          local_fd4 = 0.0;
          local_fd0 = (float *)((long)local_220 + (long)local_c54 * (long)local_fbc * local_c70);
          local_fc8 = (float *)((long)local_258 + (long)local_c0c * (long)local_fac * local_c28);
          for (local_fd8 = 0; local_fd8 < local_be8; local_fd8 = local_fd8 + 1) {
            local_fd4 = *local_fc8 * *local_fd0 + local_fd4;
            local_fd0 = local_fd0 + 1;
            local_fc8 = local_fc8 + 1;
          }
          *(float *)((long)local_fb8 + (long)local_fbc * 4) = local_fd4;
        }
      }
      local_b70 = &local_fa8;
      local_b60 = &local_f60;
      local_b50 = &local_f18;
      local_d80 = 0;
      local_d84 = 0;
      local_d88 = 0;
      local_d8c = 0;
      local_d98 = local_c18;
      local_da0 = 0;
      local_da8 = 0;
      local_db0 = 0;
      local_db8 = 0;
      local_df8 = 0;
      local_dfc = 0;
      local_e00 = 0;
      local_e04 = 0;
      local_e10 = local_c60;
      local_e18 = 0;
      local_e20 = 0;
      local_e28 = 0;
      local_e30 = 0;
      local_e70 = 0;
      local_e74 = 0;
      local_e78 = 0;
      local_e7c = 0;
      local_e88 = local_cb8;
      local_e90 = 0;
      local_e98 = 0;
      local_ea0 = 0;
      local_ea8 = 0;
      local_ef8 = local_c18;
      local_f28 = 0;
      local_f2c = 0;
      local_f30 = 0;
      local_f34 = 0;
      local_f40 = local_c60;
      local_f48 = 0;
      local_f50 = 0;
      local_f58 = 0;
      local_f60 = 0;
      local_f70 = 0;
      local_f74 = 0;
      local_f78 = 0;
      local_f7c = 0;
      local_f88 = local_d00;
      local_f90 = 0;
      local_f98 = 0;
      local_fa0 = 0;
      local_fa8 = 0;
      local_c = 0x10;
      local_1c = 0x10;
      local_2c = 0x10;
      local_3c = 0x10;
      local_4c = 0x10;
      local_5c = 0x10;
      local_1d4 = local_cf4;
      local_1d8 = local_cf0;
      local_1dc = local_cec;
      local_1f0 = local_d10;
      local_1f4 = local_d08;
      local_200 = local_d00;
      local_20c = local_c54;
      local_210 = local_c50;
      local_214 = local_c4c;
      local_228 = local_c70;
      local_22c = local_c68;
      local_238 = local_c60;
      local_244 = local_c0c;
      local_248 = local_c08;
      local_24c = local_c04;
      local_260 = local_c28;
      local_264 = local_c20;
      local_270 = local_c18;
      local_27c = local_cac;
      local_280 = local_ca8;
      local_284 = local_ca4;
      local_298 = local_cc8;
      local_29c = local_cc0;
      local_2a8 = local_cb8;
      local_2b4 = local_c54;
      local_2b8 = local_c50;
      local_2bc = local_c4c;
      local_2d0 = local_c70;
      local_2d4 = local_c68;
      local_2e0 = local_c60;
      local_2ec = local_c0c;
      local_2f0 = local_c08;
      local_2f4 = local_c04;
      local_308 = local_c28;
      local_30c = local_c20;
      local_318 = local_c18;
      local_88c = local_d70;
      local_88d = 1;
      local_8ac = local_d70;
      local_8ad = 1;
      local_8cc = local_d70;
      local_8cd = 1;
      local_8ec = local_d70;
      local_8ed = 1;
      local_90c = local_d70;
      local_90d = 1;
      local_92c = local_d70;
      local_92d = 1;
      local_d78 = 0;
      local_d90 = 0;
      local_df0 = 0;
      local_e08 = 0;
      local_e68 = 0;
      local_e80 = 0;
      local_f20 = 0;
      local_f38 = 0;
      local_f68 = 0;
      local_f80 = 0;
      local_f18 = 0;
      local_f08 = 0;
      local_f00 = 0;
      local_eec = 0;
      local_ee8 = 0;
      local_ee4 = 0;
      local_ee0 = 0;
      local_f10 = 0;
      local_940 = &local_1020;
      local_948 = &local_d20;
      local_1b0 = (void *)((long)local_d20 + local_ce0 * local_d70 * local_d10);
      local_198 = &local_1020;
      local_1018 = (int *)0x0;
      local_1010 = local_d10;
      local_1008 = local_d08;
      local_1000 = local_d00;
      local_ff4 = local_cf4;
      local_ff0 = local_cf0;
      local_fec = 1;
      local_fe8 = local_cec;
      local_68 = (long)local_cf4 * (long)local_cf0 * local_d10;
      local_fe0 = (local_68 + 0xfU & 0xfffffffffffffff0) / local_d10;
      local_ff8 = local_cf8 + -1;
      if (local_cf8 == 4) {
        local_fe0 = (long)local_cf4 * (long)local_cf0;
      }
      local_6c = 0x10;
      local_19c = local_cf4;
      local_1a0 = local_cf0;
      local_1a4 = local_cec;
      local_1b8 = local_d10;
      local_1bc = local_d08;
      local_1c8 = local_d00;
      local_94c = local_d70;
      local_94d = 1;
      local_ed8 = 0;
      local_ef0 = 0;
      local_520 = local_b50;
      local_500 = local_b60;
      local_4e0 = local_b70;
      local_4c0 = local_b80;
      local_4a0 = local_b90;
      local_480 = local_ba0;
      local_1020 = local_1b0;
      for (local_1024 = 0; local_1024 < local_be4; local_1024 = local_1024 + 1) {
        local_848 = &local_1020;
        local_84c = local_1024;
        local_1030 = (void *)((long)local_1020 + (long)local_ff4 * (long)local_1024 * local_1010);
        local_1034 = -3.4028235e+38;
        for (local_1038 = 0; local_1038 < local_be4; local_1038 = local_1038 + 1) {
          pfVar2 = std::max<float>(&local_1034,(float *)((long)local_1030 + (long)local_1038 * 4));
          local_1034 = *pfVar2;
        }
        local_103c = 0.0;
        for (local_1040 = 0; local_1040 < local_be4; local_1040 = local_1040 + 1) {
          dVar5 = std::exp((double)(ulong)(uint)(*(float *)((long)local_1030 + (long)local_1040 * 4)
                                                - local_1034));
          *(int *)((long)local_1030 + (long)local_1040 * 4) = SUB84(dVar5,0);
          local_103c = *(float *)((long)local_1030 + (long)local_1040 * 4) + local_103c;
        }
        for (local_1044 = 0; local_1044 < local_be4; local_1044 = local_1044 + 1) {
          *(float *)((long)local_1030 + (long)local_1044 * 4) =
               *(float *)((long)local_1030 + (long)local_1044 * 4) / local_103c;
        }
      }
      local_b40 = &local_1020;
      local_540 = local_b40;
      if (local_1018 != (int *)0x0) {
        local_544 = 0xffffffff;
        LOCK();
        local_548 = *local_1018;
        *local_1018 = *local_1018 + -1;
        UNLOCK();
        if (local_548 == 1) {
          if (local_1000 == (long *)0x0) {
            local_418 = local_1020;
            if (local_1020 != (void *)0x0) {
              free(local_1020);
            }
          }
          else {
            (**(code **)(*local_1000 + 0x18))(local_1000,local_1020);
          }
        }
      }
      local_960 = &local_1090;
      local_968 = &local_d20;
      local_178 = (void *)((long)local_d20 + local_ce0 * local_d70 * local_d10);
      local_160 = &local_1090;
      local_78 = (long)local_cf4 * (long)local_cf0 * local_d10;
      local_980 = &local_10d8;
      local_988 = &local_cd8;
      local_140 = (void *)((long)local_cd8 + local_c98 * local_d70 * local_cc8);
      local_128 = &local_10d8;
      local_88 = (long)local_cac * (long)local_ca8 * local_cc8;
      for (local_10dc = 0; local_10dc < local_be4; local_10dc = local_10dc + 1) {
        local_9a0 = &local_1130;
        local_9a8 = &local_d68;
        local_108 = (void *)((long)local_d68 + local_d28 * local_10dc * local_d58);
        local_f0 = &local_1130;
        local_98 = (long)local_d3c * (long)local_d38 * local_d58;
        local_1110 = local_d48;
        local_9c = 0x10;
        local_f4 = local_d3c;
        local_f8 = local_d38;
        local_fc = local_d34;
        local_110 = local_d58;
        local_114 = local_d50;
        local_120 = local_d48;
        local_9ac = local_10dc;
        local_9ad = 1;
        local_858 = &local_1130;
        local_85c = local_d70;
        local_10e8 = (void *)((long)local_108 + (long)local_d3c * (long)local_d70 * local_d58);
        local_b30 = &local_1130;
        local_1130 = 0;
        local_1120 = 0;
        local_1118 = 0;
        local_1108 = 0;
        local_1104 = 0;
        local_1100 = 0;
        local_10fc = 0;
        local_10f8 = 0;
        local_10f0 = 0;
        local_1128 = 0;
        for (local_1134 = 0; local_1134 < local_be8; local_1134 = local_1134 + 1) {
          local_7ec = local_10dc;
          local_7e8 = &local_1090;
          local_7fc = local_1134;
          local_7f8 = &local_10d8;
          local_114c = 0.0;
          local_1148 = (float *)((long)local_140 + (long)local_cac * (long)local_1134 * local_cc8);
          local_1140 = (float *)((long)local_178 + (long)local_cf4 * (long)local_10dc * local_d10);
          for (local_1150 = 0; local_1150 < local_be4; local_1150 = local_1150 + 1) {
            local_114c = *local_1140 * *local_1148 + local_114c;
            local_1148 = local_1148 + 1;
            local_1140 = local_1140 + 1;
          }
          *(float *)((long)local_10e8 + (long)local_1134 * 4) = local_114c;
        }
        local_560 = local_b30;
      }
      local_b20 = &local_10d8;
      local_fe8 = 0;
      local_fec = 0;
      local_ff0 = 0;
      local_ff4 = 0;
      local_1008 = 0;
      local_1010 = 0;
      local_1018 = (int *)0x0;
      local_1020 = (void *)0x0;
      local_1070 = local_d00;
      local_10b8 = local_cb8;
      local_7c = 0x10;
      local_8c = 0x10;
      local_12c = local_cac;
      local_130 = local_ca8;
      local_134 = local_ca4;
      local_148 = local_cc8;
      local_14c = local_cc0;
      local_158 = local_cb8;
      local_164 = local_cf4;
      local_168 = local_cf0;
      local_16c = local_cec;
      local_180 = local_d10;
      local_184 = local_d08;
      local_190 = local_d00;
      local_96c = local_d70;
      local_96d = 1;
      local_98c = local_d70;
      local_98d = 1;
      local_fe0 = 0;
      local_ff8 = 0;
      local_10d8 = 0;
      local_10c8 = 0;
      local_10c0 = 0;
      local_10b0 = 0;
      local_10ac = 0;
      local_10a8 = 0;
      local_10a4 = 0;
      local_10a0 = 0;
      local_1098 = 0;
      local_10d0 = 0;
      local_b10 = &local_1090;
      local_1090 = 0;
      local_1080 = 0;
      local_1078 = 0;
      local_1068 = 0;
      local_1064 = 0;
      local_1060 = 0;
      local_105c = 0;
      local_1058 = 0;
      local_1050 = 0;
      local_1088 = 0;
      local_5a0 = local_b10;
      local_580 = local_b20;
    }
    for (local_1154 = 0; local_1154 < local_be4; local_1154 = local_1154 + 1) {
      local_868 = local_bf0;
      local_86c = local_1154;
      local_1160 = (void *)((long)local_bf0->data +
                           (long)local_bf0->w * (long)local_1154 * local_bf0->elemsize);
      for (local_1164 = 0; local_1164 < *(int *)(in_RDI + 0xd0); local_1164 = local_1164 + 1) {
        local_9c0 = &local_11b8;
        local_9c8 = &local_d68;
        local_d0 = (float *)((long)local_d68 + local_d28 * local_1154 * local_d58);
        local_b8 = &local_11b8;
        local_1198 = local_d48;
        local_a8 = (long)local_d3c * (long)local_d38 * local_d58;
        local_ac = 0x10;
        local_bc = local_d3c;
        local_c0 = local_d38;
        local_c4 = local_d34;
        local_d8 = local_d58;
        local_dc = local_d50;
        local_e8 = local_d48;
        local_9cc = local_1154;
        local_9cd = 1;
        local_730 = &local_11b8;
        local_b00 = &local_11b8;
        local_11b8 = 0;
        local_11a8 = 0;
        local_11a0 = 0;
        local_1190 = 0;
        local_118c = 0;
        local_1188 = 0;
        local_1184 = 0;
        local_1180 = 0;
        local_1178 = 0;
        local_11b0 = 0;
        local_790 = (long *)(in_RDI + 0x290);
        local_768 = (long *)(in_RDI + 0x2d8);
        local_770 = (long)local_1164;
        local_11c4 = *(float *)(*local_768 + local_770 * 4);
        local_11c0 = (float *)(*local_790 + (long)(*(int *)(in_RDI + 0xd0) * local_1164) * 4);
        local_1170 = local_d0;
        for (local_11c8 = 0; local_11c8 < *(int *)(in_RDI + 0xd0); local_11c8 = local_11c8 + 1) {
          local_11c4 = *local_1170 * *local_11c0 + local_11c4;
          local_11c0 = local_11c0 + 1;
          local_1170 = local_1170 + 1;
        }
        *(float *)((long)local_1160 + (long)local_1164 * 4) = local_11c4;
        local_5c0 = local_b00;
      }
    }
    local_ba4 = 0;
    local_af0 = &local_d68;
    local_5e0 = local_af0;
    if (local_d60 != (int *)0x0) {
      local_5e4 = 0xffffffff;
      LOCK();
      local_5e8 = *local_d60;
      *local_d60 = *local_d60 + -1;
      UNLOCK();
      if (local_5e8 == 1) {
        if (local_d48 == (long *)0x0) {
          local_3c8 = local_d68;
          if (local_d68 != (void *)0x0) {
            free(local_d68);
          }
        }
        else {
          (**(code **)(*local_d48 + 0x18))(local_d48,local_d68);
        }
      }
    }
    local_d68 = (void *)0x0;
    local_d58 = 0;
    local_d50 = 0;
    local_d40 = 0;
    local_d3c = 0;
    local_d38 = 0;
    local_d34 = 0;
    local_d30 = 0;
    local_d28 = 0;
    local_d60 = (int *)0x0;
    local_ae0 = &local_d20;
    local_600 = local_ae0;
    if (local_d18 != (int *)0x0) {
      local_604 = 0xffffffff;
      LOCK();
      local_608 = *local_d18;
      *local_d18 = *local_d18 + -1;
      UNLOCK();
      if (local_608 == 1) {
        if (local_d00 == (long *)0x0) {
          local_3b8 = local_d20;
          if (local_d20 != (void *)0x0) {
            free(local_d20);
          }
        }
        else {
          (**(code **)(*local_d00 + 0x18))(local_d00,local_d20);
        }
      }
    }
    local_d20 = (void *)0x0;
    local_d10 = 0;
    local_d08 = 0;
    local_cf8 = 0;
    local_cf4 = 0;
    local_cf0 = 0;
    local_cec = 0;
    local_ce8 = 0;
    local_ce0 = 0;
    local_d18 = (int *)0x0;
    local_ad0 = &local_cd8;
    local_620 = local_ad0;
    if (local_cd0 != (int *)0x0) {
      local_624 = 0xffffffff;
      LOCK();
      local_628 = *local_cd0;
      *local_cd0 = *local_cd0 + -1;
      UNLOCK();
      if (local_628 == 1) {
        if (local_cb8 == (long *)0x0) {
          local_3a8 = local_cd8;
          if (local_cd8 != (void *)0x0) {
            free(local_cd8);
          }
        }
        else {
          (**(code **)(*local_cb8 + 0x18))(local_cb8,local_cd8);
        }
      }
    }
    local_cd8 = (void *)0x0;
    local_cc8 = 0;
    local_cc0 = 0;
    local_cb0 = 0;
    local_cac = 0;
    local_ca8 = 0;
    local_ca4 = 0;
    local_ca0 = 0;
    local_c98 = 0;
    local_cd0 = (int *)0x0;
    ppvVar6 = &local_c80;
    local_ac0 = ppvVar6;
    local_640 = ppvVar6;
    if (local_c78 != (int *)0x0) {
      local_644 = 0xffffffff;
      LOCK();
      local_648 = *local_c78;
      *local_c78 = *local_c78 + -1;
      UNLOCK();
      if (local_648 == 1) {
        if (local_c60 == (long *)0x0) {
          local_398 = local_c80;
          if (local_c80 != (void *)0x0) {
            free(local_c80);
          }
        }
        else {
          (**(code **)(*local_c60 + 0x18))(local_c60,local_c80);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    ppvVar6[2] = (void *)0x0;
    *(undefined4 *)(ppvVar6 + 3) = 0;
    *(undefined4 *)(ppvVar6 + 5) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
    *(undefined4 *)(ppvVar6 + 6) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
    *(undefined4 *)(ppvVar6 + 7) = 0;
    ppvVar6[8] = (void *)0x0;
    ppvVar6[1] = (void *)0x0;
    ppvVar6 = &local_c38;
    if (local_c30 != (int *)0x0) {
      local_664 = 0xffffffff;
      LOCK();
      local_668 = *local_c30;
      *local_c30 = *local_c30 + -1;
      UNLOCK();
      if (local_668 == 1) {
        local_ab0 = ppvVar6;
        local_660 = ppvVar6;
        if (local_c18 == (long *)0x0) {
          local_388 = local_c38;
          if (local_c38 != (void *)0x0) {
            free(local_c38);
          }
        }
        else {
          (**(code **)(*local_c18 + 0x18))(local_c18,local_c38);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    ppvVar6[2] = (void *)0x0;
    *(undefined4 *)(ppvVar6 + 3) = 0;
    *(undefined4 *)(ppvVar6 + 5) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
    *(undefined4 *)(ppvVar6 + 6) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
    *(undefined4 *)(ppvVar6 + 7) = 0;
    ppvVar6[8] = (void *)0x0;
    ppvVar6[1] = (void *)0x0;
  }
  return local_ba4;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[1];
    const Mat& v_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[2];

    const int seqlen = q_blob.h;
    const int embed_dim_per_head = embed_dim / num_head;

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xv(seqlen, embed_dim_per_head, num_head, 4u, opt.workspace_allocator);

    Mat xqk(seqlen, seqlen, num_head, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_head, seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrt(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_head; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + embed_dim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, seqlen)
        // xk  (embed_dim_per_head, seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] = (float)(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (seqlen, seqlen)
        // xv  (seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_head, seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}